

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestOStreamLong_Test::TestBody
          (PriceFieldTest_TestOStreamLong_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  PriceField field;
  stringstream ss;
  AssertHelper AStack_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  internal local_1b0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  PriceField local_1a0 [16];
  stringstream local_190 [16];
  ostream local_180 [112];
  ios_base local_110 [264];
  
  bidfx_public_api::price::PriceField::PriceField(local_1a0,0x85e0b0cba7);
  std::__cxx11::stringstream::stringstream(local_190);
  bidfx_public_api::price::operator<<(local_180,local_1a0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            (local_1b0,"\"575000333223\"","ss.str()",(char (*) [13])"575000333223",&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_1a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x51,message);
    testing::internal::AssertHelper::operator=(&AStack_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1d8);
    if ((long *)local_1d0._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_1d0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1d0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  bidfx_public_api::price::PriceField::~PriceField(local_1a0);
  return;
}

Assistant:

TEST(PriceFieldTest, TestOStreamLong)
{
    int64_t value = 575000333223;
    PriceField field = PriceField(value);
    std::stringstream ss;
    ss << field;
    EXPECT_EQ("575000333223", ss.str());
}